

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  pointer psVar4;
  long lVar5;
  long lVar6;
  pointer psVar7;
  
  psVar7 = (this->m_patterns).
           super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_patterns).
           super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)psVar1 - (long)psVar7;
  for (lVar6 = lVar5 >> 6; 0 < lVar6; lVar6 = lVar6 + -1) {
    peVar2 = (psVar7->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
    psVar4 = psVar7;
    if ((char)iVar3 == '\0') goto LAB_00121827;
    peVar2 = psVar7[1].super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
    if ((char)iVar3 == '\0') {
      psVar4 = psVar7 + 1;
      goto LAB_00121827;
    }
    peVar2 = psVar7[2].super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
    if ((char)iVar3 == '\0') {
      psVar4 = psVar7 + 2;
      goto LAB_00121827;
    }
    peVar2 = psVar7[3].super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
    if ((char)iVar3 == '\0') {
      psVar4 = psVar7 + 3;
      goto LAB_00121827;
    }
    psVar7 = psVar7 + 4;
    lVar5 = lVar5 + -0x40;
  }
  lVar5 = lVar5 >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      psVar4 = psVar1;
      if ((lVar5 != 3) ||
         (peVar2 = (psVar7->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr, iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase), psVar4 = psVar7,
         (char)iVar3 == '\0')) goto LAB_00121827;
      psVar7 = psVar7 + 1;
    }
    peVar2 = (psVar7->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
    psVar4 = psVar7;
    if ((char)iVar3 == '\0') goto LAB_00121827;
    psVar7 = psVar7 + 1;
  }
  peVar2 = (psVar7->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
  psVar4 = psVar7;
  if ((char)iVar3 != '\0') {
    psVar4 = psVar1;
  }
LAB_00121827:
  return psVar4 == psVar1;
}

Assistant:

bool TestSpec::Filter::matches( TestCaseInfo const& testCase ) const {
        return std::all_of( m_patterns.begin(), m_patterns.end(), [&]( PatternPtr const& p ){ return p->matches( testCase ); } );
    }